

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_without_glx.c
# Opt level: O3

int main(void)

{
  char cVar1;
  int iVar2;
  EGLDisplay pvVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  EGLConfig cfg;
  EGLint context_attribs [3];
  EGLint count;
  EGLint config_attribs [11];
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 local_4c [4];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  pvVar3 = get_egl_display_or_skip();
  local_58 = 0x200003098;
  local_50 = 0x3038;
  uStack_28 = 0x3040;
  uStack_24 = 0x303800000004;
  uStack_38 = 0x100003023;
  uStack_30 = 0x3022;
  local_2c = 1;
  local_48 = 0x3033;
  uStack_44 = 4;
  uStack_40 = 0x3024;
  uStack_3c = 1;
  _epoxy_eglBindAPI = override_eglBindAPI;
  _epoxy_eglGetError = override_eglGetError;
  cVar1 = epoxy_has_egl_extension(pvVar3,"EGL_KHR_surfaceless_context");
  if (cVar1 == '\0') {
    pcVar6 = "Test requires EGL_KHR_surfaceless_context";
LAB_00101337:
    errx(0x4d,pcVar6);
  }
  else {
    (*_epoxy_eglBindAPI)(0x30a0);
    iVar2 = (*_epoxy_eglChooseConfig)(pvVar3,&local_48,&local_60,1,local_4c);
    if (iVar2 == 0) {
      pcVar6 = "Couldn\'t get an EGLConfig\n";
      goto LAB_00101337;
    }
    lVar4 = (*_epoxy_eglCreateContext)(pvVar3,local_60,0,&local_58);
    if (lVar4 != 0) {
      (*_epoxy_eglMakeCurrent)(pvVar3,0,0,lVar4);
      uVar5 = (*_epoxy_glGetString)(0x1f02);
      printf("GL_VERSION: %s\n",uVar5);
      iVar2 = (*_epoxy_eglGetError)();
      if (iVar2 == 0x3000) {
        return 0;
      }
      goto LAB_0010135b;
    }
  }
  errx(0x4d,"Couldn\'t create a GLES%d context\n",2);
LAB_0010135b:
  __assert_fail("eglGetError() == EGL_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/yaronct[P]libepoxy/test/egl_without_glx.c"
                ,0x87,"int main(void)");
}

Assistant:

int main(void)
{
    bool pass = true;
    EGLDisplay dpy = get_egl_display_or_skip();
    EGLint context_attribs[] = {
        EGL_CONTEXT_CLIENT_VERSION, GLES_VERSION,
        EGL_NONE
    };
    EGLConfig cfg;
    EGLint config_attribs[] = {
	EGL_SURFACE_TYPE, EGL_WINDOW_BIT,
	EGL_RED_SIZE, 1,
	EGL_GREEN_SIZE, 1,
	EGL_BLUE_SIZE, 1,
#if GLES_VERSION == 2
	EGL_RENDERABLE_TYPE, EGL_OPENGL_ES2_BIT,
#else
	EGL_RENDERABLE_TYPE, EGL_OPENGL_ES_BIT,
#endif
	EGL_NONE
    };
    EGLint count;
    EGLContext ctx;
    const unsigned char *string;

    epoxy_eglBindAPI = override_eglBindAPI;
    epoxy_eglGetError = override_eglGetError;

    if (!epoxy_has_egl_extension(dpy, "EGL_KHR_surfaceless_context"))
        errx(77, "Test requires EGL_KHR_surfaceless_context");

    eglBindAPI(EGL_OPENGL_ES_API);

    if (!eglChooseConfig(dpy, config_attribs, &cfg, 1, &count))
        errx(77, "Couldn't get an EGLConfig\n");

    ctx = eglCreateContext(dpy, cfg, NULL, context_attribs);
    if (!ctx)
        errx(77, "Couldn't create a GLES%d context\n", GLES_VERSION);

    eglMakeCurrent(dpy, NULL, NULL, ctx);

    string = glGetString(GL_VERSION);
    printf("GL_VERSION: %s\n", string);

    assert(eglGetError() == EGL_SUCCESS);

    return pass != true;
}